

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char> __thiscall
fmt::v11::detail::write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_long>
          (detail *this,basic_appender<char> out,write_int_arg<unsigned_long> arg,
          format_specs *specs)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  basic_appender<char> bVar5;
  format_specs *specs_00;
  long lVar6;
  uint uVar7;
  int num_digits;
  anon_class_24_4_0fb5e8cf local_98;
  size_padding sp;
  char buffer [64];
  char local_38 [8];
  
  specs_00 = arg._8_8_;
  uVar7 = (uint)arg.abs_value;
  uVar2 = (specs_00->super_basic_specs).data_;
  pcVar4 = local_38;
  switch(uVar2 & 7) {
  case 4:
    pcVar4 = do_format_base2e<char,unsigned_long>
                       (4,buffer,(unsigned_long)out.container,0x40,(bool)((byte)(uVar2 >> 0xc) & 1))
    ;
    uVar2 = (specs_00->super_basic_specs).data_;
    if ((uVar2 >> 0xd & 1) != 0) {
      uVar3 = (uint)((uVar2 >> 0xc & 1) == 0) << 0xd | 0x5830;
      uVar2 = uVar3 << 8;
      if (uVar7 == 0) {
        uVar2 = uVar3;
      }
      uVar7 = (uVar2 | uVar7) + 0x2000000;
    }
    break;
  case 5:
    lVar6 = 0;
    bVar5.container = out.container;
    do {
      pcVar4[-1] = (byte)bVar5.container & 7 | 0x30;
      pcVar4 = pcVar4 + -1;
      lVar6 = lVar6 + 1;
      bVar1 = (buffer<char> *)0x7 < bVar5.container;
      bVar5.container = bVar5.container >> 3;
    } while (bVar1);
    if (((uVar2 >> 0xd & 1) != 0) &&
       (out.container != (buffer<char> *)0x0 && specs_00->precision <= lVar6)) {
      uVar2 = 0x3000;
      if (uVar7 == 0) {
        uVar2 = 0x30;
      }
      uVar7 = (uVar2 | uVar7) + 0x1000000;
    }
    break;
  case 6:
    do {
      pcVar4[-1] = (byte)out.container & 1 | 0x30;
      pcVar4 = pcVar4 + -1;
      bVar1 = (buffer<char> *)0x1 < out.container;
      out.container = out.container >> 1;
    } while (bVar1);
    if ((uVar2 >> 0xd & 1) != 0) {
      uVar3 = (uint)((uVar2 >> 0xc & 1) == 0) << 0xd | 0x4230;
      uVar2 = uVar3 << 8;
      if (uVar7 == 0) {
        uVar2 = uVar3;
      }
      uVar7 = (uVar2 | uVar7) + 0x2000000;
    }
    break;
  case 7:
    bVar5 = write_char<char,fmt::v11::basic_appender<char>>
                      ((basic_appender<char>)this,(char)out.container,specs_00);
    return (basic_appender<char>)bVar5.container;
  default:
    pcVar4 = do_format_decimal<char,unsigned_long>(buffer,(unsigned_long)out.container,0x40);
  }
  num_digits = (int)local_38 - (int)pcVar4;
  if (specs_00->precision == -1 && specs_00->width == 0) {
    bVar5 = reserve<char>((basic_appender<char>)this,(ulong)((uVar7 >> 0x18) + num_digits));
    for (uVar7 = uVar7 & 0xffffff; uVar7 != 0; uVar7 = uVar7 >> 8) {
      local_98._0_8_ = bVar5;
      basic_appender<char>::operator=((basic_appender<char> *)&local_98,(char)uVar7);
    }
    buffer<char>::append<char>(bVar5.container,pcVar4,local_38);
  }
  else {
    size_padding::size_padding(&sp,num_digits,uVar7,specs_00);
    local_98.padding = sp.padding;
    local_98.prefix = uVar7;
    local_98.begin = pcVar4;
    local_98.end = local_38;
    bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned_long>(fmt::v11::basic_appender<char>,fmt::v11::detail::write_int_arg<unsigned_long>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                      ((basic_appender<char>)this,specs_00,(ulong)sp.size,&local_98);
  }
  return (basic_appender<char>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(OutputIt out,
                                                   write_int_arg<T> arg,
                                                   const format_specs& specs)
    -> OutputIt {
  return write_int<Char>(out, arg, specs);
}